

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

qpdf_oh qpdf_get_root(qpdf_data qpdf)

{
  qpdf_data qpdf_00;
  uint uVar1;
  anon_class_1_0_00000001 local_51;
  function<unsigned_int_(_qpdf_data_*)> local_50;
  function<unsigned_int_()> local_30;
  qpdf_data local_10;
  qpdf_data qpdf_local;
  
  local_10 = qpdf;
  QTC::TC("qpdf","qpdf-c called qpdf_get_root",0);
  qpdf_00 = local_10;
  return_uninitialized(&local_30,local_10);
  std::function<unsigned_int(_qpdf_data*)>::function<qpdf_get_root::__0,void>
            ((function<unsigned_int(_qpdf_data*)> *)&local_50,&local_51);
  uVar1 = trap_oh_errors<unsigned_int>(qpdf_00,&local_30,&local_50);
  std::function<unsigned_int_(_qpdf_data_*)>::~function(&local_50);
  std::function<unsigned_int_()>::~function(&local_30);
  return uVar1;
}

Assistant:

qpdf_oh
qpdf_get_root(qpdf_data qpdf)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_get_root");
    return trap_oh_errors<qpdf_oh>(qpdf, return_uninitialized(qpdf), [](qpdf_data q) {
        return new_object(q, q->qpdf->getRoot());
    });
}